

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.h
# Opt level: O2

void __thiscall ValidateFootprint::ValidateFootprint(ValidateFootprint *this)

{
  (this->super_Validate).lineno_ = 1;
  (this->super_Validate).warnings_ = false;
  (this->super_Validate).MIN_ID_ = 1;
  this->_vptr_ValidateFootprint = (_func_int **)&PTR_SetPreviousEventID_00108d78;
  this->convertToBin_ = false;
  this->validationCheck_ = true;
  builtin_strncpy(this->eveIDName_,"Event",6);
  builtin_strncpy(this->areaperilIDName_,"Areaperil",10);
  (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->maxIntensityBin_ = 0;
  builtin_strncpy((this->super_Validate).fileDescription_,"Footprint",10);
  return;
}

Assistant:

ValidateFootprint() {
    strcpy(fileDescription_, "Footprint");
  }